

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supplies.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::Supplies::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Supplies *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString KStack_1b8;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  EntityType::GetAsString_abi_cxx11_(&KStack_1b8,&this->super_EntityType);
  poVar1 = std::operator<<(local_188,(string *)&KStack_1b8);
  poVar1 = std::operator<<(poVar1,"Quantity:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(float)this->m_f32Quantity);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&KStack_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

KString Supplies::GetAsString() const
{
    KStringStream ss;

    ss << EntityType::GetAsString()
       << "Quantity:   " << m_f32Quantity
       << "\n";

    return ss.str();
}